

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.cpp
# Opt level: O0

FStat * FStat::FindStat(char *name)

{
  int iVar1;
  bool bVar2;
  FStat *local_18;
  FStat *stat;
  char *name_local;
  
  local_18 = FirstStat;
  while( true ) {
    bVar2 = false;
    if (local_18 != (FStat *)0x0) {
      iVar1 = strcasecmp(name,local_18->m_Name);
      bVar2 = iVar1 != 0;
    }
    if (!bVar2) break;
    local_18 = local_18->m_Next;
  }
  return local_18;
}

Assistant:

FStat *FStat::FindStat (const char *name)
{
	FStat *stat = FirstStat;

	while (stat && stricmp (name, stat->m_Name))
		stat = stat->m_Next;

	return stat;
}